

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

SerializeLedgerFormatRequest * __thiscall
cfd::js::api::json::SerializeLedgerFormatRequest::GetTxString_abi_cxx11_
          (SerializeLedgerFormatRequest *this,SerializeLedgerFormatRequest *obj)

{
  SerializeLedgerFormatRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->tx_);
  return this;
}

Assistant:

static std::string GetTxString(  // line separate
      const SerializeLedgerFormatRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.tx_);
  }